

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O0

void __thiscall
OpenMD::
OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
::OrParamConstraint(OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                    *this,OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                          *param_2)

{
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  *in_RSI;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_RDI;
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  *in_stack_ffffffffffffffc8;
  EqualIgnoreCaseConstraint *pEVar1;
  EqualIgnoreCaseConstraint *in_stack_ffffffffffffffe0;
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  *in_stack_ffffffffffffffe8;
  
  ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  ::ParamConstraintFacade(in_RDI,in_stack_ffffffffffffffc8);
  pEVar1 = (EqualIgnoreCaseConstraint *)(in_RDI + 1);
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  ::OrParamConstraint(in_RSI,in_stack_ffffffffffffffe8);
  EqualIgnoreCaseConstraint::EqualIgnoreCaseConstraint(in_stack_ffffffffffffffe0,pEVar1);
  return;
}

Assistant:

OrParamConstraint(Cons1T cons1, Cons2T cons2) :
        cons1_(cons1), cons2_(cons2) {
      std::stringstream iss;
      iss << cons1_.getConstraintDescription() << " or "
          << cons2_.getConstraintDescription() << "";
      this->description_ = iss.str();
    }